

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void writeSamples(FILE *outFile,vector<float_*,_std::allocator<float_*>_> *outChannelBufs,
                 int channels,int samples,int bytesPerSample)

{
  reference ppfVar1;
  int *piVar2;
  ulong uVar3;
  int local_48;
  int local_44;
  int b;
  int local_3c;
  int32_t sample;
  int c;
  int i;
  int32_t maxAbsSampleVal;
  uint8_t *outBufInterleaved;
  int ioBlockSize;
  int bytesPerSample_local;
  int samples_local;
  int channels_local;
  vector<float_*,_std::allocator<float_*>_> *outChannelBufs_local;
  FILE *outFile_local;
  
  outBufInterleaved._0_4_ = channels * samples * bytesPerSample;
  uVar3 = (ulong)(int)outBufInterleaved;
  if ((long)uVar3 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  outBufInterleaved._4_4_ = bytesPerSample;
  ioBlockSize = samples;
  bytesPerSample_local = channels;
  _samples_local = outChannelBufs;
  outChannelBufs_local = (vector<float_*,_std::allocator<float_*>_> *)outFile;
  _i = operator_new__(uVar3);
  c = (0x80 << (((char)outBufInterleaved._4_4_ + -1) * '\b' & 0x1fU)) + -2;
  for (sample = 0; sample < ioBlockSize; sample = sample + 1) {
    for (local_3c = 0; local_3c < bytesPerSample_local; local_3c = local_3c + 1) {
      ppfVar1 = std::vector<float_*,_std::allocator<float_*>_>::operator[]
                          (outChannelBufs,(long)local_3c);
      b = (int)(*ppfVar1)[sample];
      local_44 = -c;
      piVar2 = std::max<int>(&b,&local_44);
      piVar2 = std::min<int>(piVar2,&c);
      b = *piVar2;
      for (local_48 = 0; local_48 < outBufInterleaved._4_4_; local_48 = local_48 + 1) {
        *(char *)((long)_i +
                 (long)(sample * bytesPerSample_local * outBufInterleaved._4_4_ +
                        local_3c * outBufInterleaved._4_4_ + local_48)) =
             (char)(b >> ((byte)(local_48 << 3) & 0x1f));
      }
    }
  }
  fwrite(_i,1,(long)(int)outBufInterleaved,(FILE *)outChannelBufs_local);
  return;
}

Assistant:

void writeSamples(FILE* outFile, std::vector<float*> outChannelBufs, int channels, int samples, int bytesPerSample){
	int ioBlockSize = channels * samples * bytesPerSample;
	uint8_t *outBufInterleaved = new uint8_t[ioBlockSize];
	int32_t maxAbsSampleVal = (0x80 << ((bytesPerSample - 1) * 8)) - 2;
	for(int i = 0; i < samples; i++){
		for(int c = 0; c < channels; c++){
			int32_t sample = (int32_t) outChannelBufs[c][i];
			sample = std::min(std::max(sample, -maxAbsSampleVal), maxAbsSampleVal);
			for(int b = 0; b < bytesPerSample; b++){
				outBufInterleaved[i * channels * bytesPerSample + c * bytesPerSample + b] = (sample >> (8 * b)) & 0xff;
			}
		}
	}
	fwrite(outBufInterleaved, 1, ioBlockSize, outFile);
}